

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

bool __thiscall cmFileAPI::ReadJsonFile(cmFileAPI *this,string *file,Value *value,string *error)

{
  CharReader *pCVar1;
  bool bVar2;
  int iVar3;
  size_type __new_size;
  vector<char,_std::allocator<char>_> content;
  ifstream fin;
  vector<char,_std::allocator<char>_> local_268;
  Value local_250;
  long local_228 [2];
  long local_218 [2];
  byte abStack_208 [488];
  
  local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_228);
  bVar2 = cmsys::SystemTools::FileIsDirectory(file);
  if (!bVar2) {
    std::ifstream::open((char *)local_228,(_Ios_Openmode)(file->_M_dataplus)._M_p);
  }
  __new_size = (**(code **)(local_218[0] + 0x20))(local_218,0,2,0x18);
  if (0 < (long)__new_size) {
    std::vector<char,_std::allocator<char>_>::resize(&local_268,__new_size);
    std::istream::seekg((long)local_228,_S_beg);
    std::istream::read((char *)local_228,
                       (long)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
  }
  std::ifstream::close();
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    pCVar1 = (this->JsonReader)._M_t.
             super___uniq_ptr_impl<Json::CharReader,_std::default_delete<Json::CharReader>_>._M_t.
             super__Tuple_impl<0UL,_Json::CharReader_*,_std::default_delete<Json::CharReader>_>.
             super__Head_base<0UL,_Json::CharReader_*,_false>._M_head_impl;
    iVar3 = (*pCVar1->_vptr_CharReader[2])
                      (pCVar1,local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                       local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,value,error);
    bVar2 = true;
    if ((char)iVar3 == '\0') {
      Json::Value::Value(&local_250,nullValue);
      Json::Value::operator=(value,&local_250);
      Json::Value::~Value(&local_250);
      bVar2 = false;
    }
  }
  else {
    Json::Value::Value(&local_250,nullValue);
    Json::Value::operator=(value,&local_250);
    Json::Value::~Value(&local_250);
    bVar2 = false;
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x79cf8e);
  }
  std::ifstream::~ifstream(local_228);
  if (local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool cmFileAPI::ReadJsonFile(std::string const& file, Json::Value& value,
                             std::string& error)
{
  std::vector<char> content;

  cmsys::ifstream fin;
  if (!cmSystemTools::FileIsDirectory(file)) {
    fin.open(file.c_str(), std::ios::binary);
  }
  auto finEnd = fin.rdbuf()->pubseekoff(0, std::ios::end);
  if (finEnd > 0) {
    size_t finSize = finEnd;
    try {
      // Allocate a buffer to read the whole file.
      content.resize(finSize);

      // Now read the file from the beginning.
      fin.seekg(0, std::ios::beg);
      fin.read(content.data(), finSize);
    } catch (...) {
      fin.setstate(std::ios::failbit);
    }
  }
  fin.close();
  if (!fin) {
    value = Json::Value();
    error = "failed to read from file";
    return false;
  }

  // Parse our buffer as json.
  if (!this->JsonReader->parse(content.data(), content.data() + content.size(),
                               &value, &error)) {
    value = Json::Value();
    return false;
  }

  return true;
}